

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::GetOneofStoredType_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  JavaType type;
  Descriptor *this_00;
  char *pcVar1;
  Descriptor *descriptor;
  allocator local_11;
  
  type = GetJavaType((FieldDescriptor *)this);
  if (type == JAVATYPE_MESSAGE) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassName_abi_cxx11_(__return_storage_ptr__,(java *)this_00,descriptor);
  }
  else if (type == JAVATYPE_ENUM) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"java.lang.Integer","");
  }
  else {
    pcVar1 = BoxedPrimitiveTypeName(type);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOneofStoredType(const FieldDescriptor* field) {
  const JavaType javaType = GetJavaType(field);
  switch (javaType) {
    case JAVATYPE_ENUM:
      return "java.lang.Integer";
    case JAVATYPE_MESSAGE:
      return ClassName(field->message_type());
    default:
      return BoxedPrimitiveTypeName(javaType);
  }
}